

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_raw_key_agreement
          (psa_algorithm_t alg,psa_key_handle_t private_key,uint8_t *peer_key,size_t peer_key_length
          ,uint8_t *output,size_t output_size,size_t *output_length)

{
  psa_status_t pVar1;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_38;
  
  pVar1 = -0x87;
  if ((((alg & 0x7f000000) == 0x30000000) &&
      (pVar1 = psa_get_key_from_slot(private_key,&local_38,0x1000,alg), pVar1 == 0)) &&
     (pVar1 = psa_key_agreement_raw_internal
                        (alg,local_38,peer_key,peer_key_length,output,output_size,output_length),
     pVar1 == 0)) {
    pVar1 = 0;
  }
  else {
    psa_generate_random(output,output_size);
    *output_length = output_size;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_raw_key_agreement( psa_algorithm_t alg,
                                    psa_key_handle_t private_key,
                                    const uint8_t *peer_key,
                                    size_t peer_key_length,
                                    uint8_t *output,
                                    size_t output_size,
                                    size_t *output_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    if( ! PSA_ALG_IS_KEY_AGREEMENT( alg ) )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }
    status = psa_get_transparent_key( private_key, &slot,
                                      PSA_KEY_USAGE_DERIVE, alg );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_key_agreement_raw_internal( alg, slot,
                                             peer_key, peer_key_length,
                                             output, output_size,
                                             output_length );

exit:
    if( status != PSA_SUCCESS )
    {
        /* If an error happens and is not handled properly, the output
         * may be used as a key to protect sensitive data. Arrange for such
         * a key to be random, which is likely to result in decryption or
         * verification errors. This is better than filling the buffer with
         * some constant data such as zeros, which would result in the data
         * being protected with a reproducible, easily knowable key.
         */
        psa_generate_random( output, output_size );
        *output_length = output_size;
    }
    return( status );
}